

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

Vec4 __thiscall
vkt::api::anon_unknown_0::getFormatThreshold(anon_unknown_0 *this,TextureFormat *format)

{
  ChannelType CVar1;
  float s;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  ulong in_XMM1_Qa;
  Vec4 VVar2;
  IVec4 bits;
  Vector<float,_4> local_48;
  float local_34;
  float local_30;
  float local_2c;
  Vector<float,_4> local_28;
  
  tcu::Vector<float,_4>::Vector(&local_48,0.01);
  CVar1 = format->type;
  if (CVar1 - FLOAT < 2) {
    s = 0.001;
  }
  else {
    if (CVar1 == UNSIGNED_INT_11F_11F_10F_REV) {
      local_48.m_data[0] = 0.02;
      local_48.m_data[1] = 0.02;
      local_48.m_data[2] = 0.0625;
      local_48.m_data[3] = 1.0;
      goto LAB_004c5a7f;
    }
    if (CVar1 == UNSIGNED_INT_999_E5_REV) {
      local_48.m_data[0] = 0.05;
      local_48.m_data[1] = 0.05;
      local_48.m_data[2] = 0.05;
      local_48.m_data[3] = 1.0;
      goto LAB_004c5a7f;
    }
    if (CVar1 != HALF_FLOAT) {
      tcu::getTextureFormatMantissaBitDepth((tcu *)&local_28,format);
      local_2c = calculateFloatConversionError((int)local_28.m_data[0]);
      local_30 = calculateFloatConversionError((int)local_28.m_data[1]);
      local_34 = calculateFloatConversionError((int)local_28.m_data[2]);
      local_48.m_data[3] = calculateFloatConversionError((int)local_28.m_data[3]);
      local_48.m_data[0] = local_2c;
      local_48.m_data[1] = local_30;
      in_XMM1_Qa = (ulong)(uint)local_34;
      local_48.m_data[2] = local_34;
      goto LAB_004c5a7f;
    }
    s = 0.005;
  }
  tcu::Vector<float,_4>::Vector(&local_28,s);
  local_48.m_data[0] = local_28.m_data[0];
  local_48.m_data[1] = local_28.m_data[1];
  local_48.m_data[2] = local_28.m_data[2];
  local_48.m_data[3] = local_28.m_data[3];
LAB_004c5a7f:
  if ((format->order & ~A) == BGR) {
    *(float *)this = local_48.m_data[2];
    *(float *)(this + 4) = local_48.m_data[1];
    *(float *)(this + 8) = local_48.m_data[0];
    *(float *)(this + 0xc) = local_48.m_data[3];
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,&local_48);
    local_48.m_data[2] = extraout_XMM0_Da;
    local_48.m_data[1] = extraout_XMM0_Db;
  }
  VVar2.m_data[1] = local_48.m_data[1];
  VVar2.m_data[0] = local_48.m_data[2];
  VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar2.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 getFormatThreshold (const tcu::TextureFormat& format)
{
	tcu::Vec4 threshold(0.01f);

	switch (format.type)
	{
	case tcu::TextureFormat::HALF_FLOAT:
		threshold = tcu::Vec4(0.005f);
		break;

	case tcu::TextureFormat::FLOAT:
	case tcu::TextureFormat::FLOAT64:
		threshold = tcu::Vec4(0.001f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		threshold = tcu::Vec4(0.02f, 0.02f, 0.0625f, 1.0f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_999_E5_REV:
		threshold = tcu::Vec4(0.05f, 0.05f, 0.05f, 1.0f);
		break;

	default:
		const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);
		threshold = tcu::Vec4(calculateFloatConversionError(bits.x()),
				      calculateFloatConversionError(bits.y()),
				      calculateFloatConversionError(bits.z()),
				      calculateFloatConversionError(bits.w()));
	}

	// Return value matching the channel order specified by the format
	if (format.order == tcu::TextureFormat::BGR || format.order == tcu::TextureFormat::BGRA)
		return threshold.swizzle(2, 1, 0, 3);
	else
		return threshold;
}